

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O3

void udp_pipe_fini(void *arg)

{
  nni_lmq *lmq;
  _Bool _Var1;
  int iVar2;
  nni_msg *in_RAX;
  nni_msg *local_28;
  nng_msg *m;
  
  lmq = (nni_lmq *)((long)arg + 0xe0);
  local_28 = in_RAX;
  _Var1 = nni_lmq_empty(lmq);
  if (!_Var1) {
    do {
      nni_lmq_get(lmq,&local_28);
      nni_msg_free(local_28);
      _Var1 = nni_lmq_empty(lmq);
    } while (!_Var1);
  }
  nni_lmq_fini(lmq);
  iVar2 = nni_list_empty((nni_list *)((long)arg + 0x128));
  if (iVar2 == 0) {
    nni_panic("%s: %d: assert err: %s",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/udp/udp.c"
              ,0x14a,"nni_list_empty(&p->rx_aios)");
  }
  return;
}

Assistant:

static void
udp_pipe_fini(void *arg)
{
	udp_pipe *p = arg;
	nng_msg  *m;

	// call with ep->mtx lock held
	while (!nni_lmq_empty(&p->rx_mq)) {
		nni_lmq_get(&p->rx_mq, &m);
		nni_msg_free(m);
	}
	nni_lmq_fini(&p->rx_mq);
	NNI_ASSERT(nni_list_empty(&p->rx_aios));
}